

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-pongs.c
# Opt level: O3

int run_benchmark_ping_pongs(void)

{
  size_t sVar1;
  int iVar2;
  uv_write_t *req;
  buf_t *pbVar3;
  undefined8 *extraout_RDX;
  uv_loop_t *unaff_RBX;
  int iVar4;
  uv_loop_t **ppuVar5;
  sockaddr_in *addr;
  char *loop;
  uv_loop_t *stream;
  uv_loop_t **unaff_R14;
  sockaddr_in client_addr;
  uv_buf_t uStack_60;
  uv_loop_t *puStack_50;
  uv_loop_t **ppuStack_48;
  uv_loop_t *puStack_40;
  sockaddr_in local_30;
  sockaddr_in local_20;
  
  puStack_40 = (uv_loop_t *)0x10bec8;
  ::loop = uv_default_loop();
  puStack_40 = (uv_loop_t *)0x10bed7;
  start_time = uv_now(::loop);
  loop = "0.0.0.0";
  iVar4 = 0;
  puStack_40 = (uv_loop_t *)0x10bef1;
  iVar2 = uv_ip4_addr("0.0.0.0",0,&local_20);
  if (iVar2 == 0) {
    loop = "127.0.0.1";
    iVar4 = 0x23a3;
    puStack_40 = (uv_loop_t *)0x10bf0f;
    iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&local_30);
    if (iVar2 != 0) goto LAB_0010bfe2;
    puStack_40 = (uv_loop_t *)0x10bf21;
    unaff_RBX = (uv_loop_t *)malloc(0x1b0);
    unaff_RBX->data = (void *)0x0;
    unaff_R14 = (uv_loop_t **)&unaff_RBX->active_handles;
    puStack_40 = (uv_loop_t *)0x10bf3e;
    ppuVar5 = unaff_R14;
    loop = (char *)::loop;
    iVar2 = uv_tcp_init(::loop,(uv_tcp_t *)unaff_R14);
    iVar4 = (int)ppuVar5;
    if (iVar2 != 0) goto LAB_0010bfe7;
    *(uv_loop_t **)&unaff_RBX->active_handles = unaff_RBX;
    addr = &local_20;
    puStack_40 = (uv_loop_t *)0x10bf59;
    loop = (char *)unaff_R14;
    iVar2 = uv_tcp_bind((uv_tcp_t *)unaff_R14,(sockaddr *)addr,0);
    iVar4 = (int)addr;
    if (iVar2 != 0) goto LAB_0010bfec;
    unaff_RBX = (uv_loop_t *)&(unaff_RBX->wq_async).next_closing;
    puStack_40 = (uv_loop_t *)0x10bf7f;
    ppuVar5 = unaff_R14;
    loop = (char *)unaff_RBX;
    iVar2 = uv_tcp_connect((uv_connect_t *)unaff_RBX,(uv_tcp_t *)unaff_R14,(sockaddr *)&local_30,
                           pinger_connect_cb);
    iVar4 = (int)ppuVar5;
    if (iVar2 != 0) goto LAB_0010bff1;
    iVar4 = 0;
    puStack_40 = (uv_loop_t *)0x10bf91;
    loop = (char *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (completed_pingers == 1) {
      puStack_40 = (uv_loop_t *)0x10bf9f;
      unaff_RBX = uv_default_loop();
      puStack_40 = (uv_loop_t *)0x10bfb3;
      uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
      iVar4 = 0;
      puStack_40 = (uv_loop_t *)0x10bfbd;
      uv_run(unaff_RBX,UV_RUN_DEFAULT);
      puStack_40 = (uv_loop_t *)0x10bfc2;
      loop = (char *)uv_default_loop();
      puStack_40 = (uv_loop_t *)0x10bfca;
      iVar2 = uv_loop_close((uv_loop_t *)loop);
      if (iVar2 == 0) {
        puStack_40 = (uv_loop_t *)0x10bfd3;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0010bffb;
    }
  }
  else {
    puStack_40 = (uv_loop_t *)0x10bfe2;
    run_benchmark_ping_pongs_cold_1();
LAB_0010bfe2:
    puStack_40 = (uv_loop_t *)0x10bfe7;
    run_benchmark_ping_pongs_cold_2();
LAB_0010bfe7:
    puStack_40 = (uv_loop_t *)0x10bfec;
    run_benchmark_ping_pongs_cold_3();
LAB_0010bfec:
    puStack_40 = (uv_loop_t *)0x10bff1;
    run_benchmark_ping_pongs_cold_4();
LAB_0010bff1:
    puStack_40 = (uv_loop_t *)0x10bff6;
    run_benchmark_ping_pongs_cold_5();
  }
  puStack_40 = (uv_loop_t *)0x10bffb;
  run_benchmark_ping_pongs_cold_6();
LAB_0010bffb:
  puStack_40 = (uv_loop_t *)pinger_connect_cb;
  run_benchmark_ping_pongs_cold_7();
  puStack_40 = unaff_RBX;
  if (iVar4 == 0) {
    ppuStack_48 = (uv_loop_t **)0x10c014;
    pinger_write_ping(*((uv_loop_t *)loop)->pending_queue[0]);
    stream = (uv_loop_t *)((uv_loop_t *)loop)->pending_queue[0];
    ppuStack_48 = (uv_loop_t **)0x10c02b;
    iVar2 = uv_read_start((uv_stream_t *)stream,buf_alloc,pinger_read_cb);
    unaff_RBX = (uv_loop_t *)loop;
    loop = (char *)stream;
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    ppuStack_48 = (uv_loop_t **)0x10c036;
    pinger_connect_cb_cold_1();
  }
  ppuStack_48 = (uv_loop_t **)pinger_write_ping;
  pinger_connect_cb_cold_2();
  puStack_50 = unaff_RBX;
  ppuStack_48 = unaff_R14;
  uStack_60 = uv_buf_init(PING,5);
  req = (uv_write_t *)malloc(0xc0);
  ppuVar5 = (uv_loop_t **)&((uv_loop_t *)loop)->active_handles;
  iVar2 = uv_write(req,(uv_stream_t *)ppuVar5,&uStack_60,1,pinger_write_cb);
  if (iVar2 == 0) {
    return 0;
  }
  pinger_write_ping_cold_1();
  if (buf_freelist == (buf_t *)0x0) {
    pbVar3 = (buf_t *)malloc((size_t)(ppuVar5 + 3));
    (pbVar3->uv_buf_t).len = (size_t)ppuVar5;
    (pbVar3->uv_buf_t).base = (char *)(pbVar3 + 1);
  }
  else {
    pbVar3 = buf_freelist;
    buf_freelist = buf_freelist->next;
  }
  sVar1 = (pbVar3->uv_buf_t).len;
  *extraout_RDX = (pbVar3->uv_buf_t).base;
  extraout_RDX[1] = sVar1;
  return (int)pbVar3;
}

Assistant:

BENCHMARK_IMPL(ping_pongs) {
  loop = uv_default_loop();

  start_time = uv_now(loop);

  pinger_new();
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(completed_pingers == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}